

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O1

void GetDefault(void)

{
  char *pcVar1;
  
  if (Current != (tchar_t *)0x0) {
    return;
  }
  setlocale(6,"");
  Current = setlocale(0,"");
  if (Current != (char *)0x0) {
    Current = strrchr(Current,0x2e);
  }
  pcVar1 = Current + 1;
  if (Current == (tchar_t *)0x0) {
    pcVar1 = "";
  }
  Current = pcVar1;
  return;
}

Assistant:

static NOINLINE void GetDefault(void)
{
    if (!Current)
    {
        setlocale(LC_ALL,""); // set default for all
        Current = setlocale(LC_CTYPE,"");
        if (Current)
            Current = strrchr(Current,'.');
        if (Current)
           ++Current;
        else
           Current = "";
    }
}